

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O0

region * visible_region_at(level *lev,xchar x,xchar y)

{
  boolean bVar1;
  int local_20;
  int i;
  xchar y_local;
  xchar x_local;
  level *lev_local;
  
  local_20 = 0;
  while( true ) {
    if (lev->n_regions <= local_20) {
      return (region *)0x0;
    }
    bVar1 = inside_region(lev->regions[local_20],(int)x,(int)y);
    if (((bVar1 != '\0') && (lev->regions[local_20]->visible != '\0')) &&
       (lev->regions[local_20]->ttl != 0)) break;
    local_20 = local_20 + 1;
  }
  return lev->regions[local_20];
}

Assistant:

struct region *visible_region_at(struct level *lev, xchar x, xchar y)
{
    int i;

    for (i = 0; i < lev->n_regions; i++)
	if (inside_region(lev->regions[i], x, y) && lev->regions[i]->visible &&
		lev->regions[i]->ttl != 0)
	    return lev->regions[i];
    return NULL;
}